

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

vector<arc::atom,_std::allocator<arc::atom>_> *
arc::atom_to_vector(vector<arc::atom,_std::allocator<arc::atom>_> *__return_storage_ptr__,atom *a)

{
  atom *paVar1;
  
  (__return_storage_ptr__->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (a->type != T_NIL) {
    paVar1 = car(a);
    std::vector<arc::atom,_std::allocator<arc::atom>_>::push_back(__return_storage_ptr__,paVar1);
    paVar1 = cdr(a);
    atom::operator=(a,paVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<atom> atom_to_vector(atom a) {
		vector<atom> r;
		for (; !no(a); a = cdr(a)) {
			r.push_back(car(a));
		}
		return r;
	}